

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stochastic.hxx
# Opt level: O2

void __thiscall StochasticProcess::~StochasticProcess(StochasticProcess *this)

{
  (this->super_Parametric)._vptr_Parametric = (_func_int **)&PTR__StochasticProcess_00154c18;
  (this->super_TimeDependent)._vptr_TimeDependent = (_func_int **)&PTR__StochasticProcess_00154ca0;
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__StochasticProcess_00154ce8;
  std::__cxx11::string::~string((string *)&this->stochDescription);
  Physical::~Physical(&this->super_Physical);
  TimeDependent::~TimeDependent(&this->super_TimeDependent);
  Parametric::~Parametric(&this->super_Parametric);
  return;
}

Assistant:

virtual ~StochasticProcess() {}